

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex_and_subfaces<short[4]>
          (Simplex_tree<MiniSTOptions> *this,short (*Nsimplex) [4],Filtration_value *filtration)

{
  short sVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  Filtration_value *pFVar5;
  short *psVar6;
  undefined8 *puVar7;
  short sVar8;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> _Var9;
  Filtration_value *pFVar10;
  const_iterator __cbeg;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar11;
  
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    insert_simplex_and_subfaces<short[4]>();
  }
  lVar2 = in_FS_OFFSET[-0x1c];
  if (in_FS_OFFSET[-0x1b] != lVar2) {
    in_FS_OFFSET[-0x1b] = lVar2;
  }
  std::vector<short,std::allocator<short>>::_M_range_insert<short_const*>
            ((vector<short,std::allocator<short>> *)(*in_FS_OFFSET + -0xe0),lVar2,filtration,
             filtration + 1);
  last._M_current = (short *)in_FS_OFFSET[-0x1c];
  filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  if ((Filtration_value *)last._M_current != filt) {
    uVar4 = (long)filt - (long)last._M_current >> 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (last._M_current,filt,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (last._M_current,filt);
    last._M_current = (short *)in_FS_OFFSET[-0x1c];
    filt = (Filtration_value *)in_FS_OFFSET[-0x1b];
  }
  if ((Filtration_value *)last._M_current != filt) {
    pFVar10 = (Filtration_value *)(last._M_current + 1);
    do {
      pFVar5 = pFVar10;
      if (pFVar5 == filt) goto LAB_0010d982;
      pFVar10 = (Filtration_value *)((long)pFVar5 + 2);
    } while (*(short *)((long)pFVar5 + -2) != *(short *)pFVar5);
    psVar6 = (short *)((long)pFVar5 + -2);
    sVar8 = *(short *)((long)pFVar5 + -2);
    for (; pFVar10 != filt; pFVar10 = (Filtration_value *)((long)pFVar10 + 2)) {
      sVar1 = *(short *)pFVar10;
      if (sVar8 != sVar1) {
        psVar6[1] = sVar1;
        psVar6 = psVar6 + 1;
      }
      sVar8 = sVar1;
    }
    pFVar10 = (Filtration_value *)(psVar6 + 1);
    if (pFVar10 != filt) {
      in_FS_OFFSET[-0x1b] = (long)pFVar10;
      filt = pFVar10;
    }
  }
LAB_0010d982:
  if ((Filtration_value *)last._M_current != filt) {
    _Var9._M_current = last._M_current;
    do {
      if (*_Var9._M_current == Nsimplex[7][0]) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      _Var9._M_current = _Var9._M_current + 2;
    } while ((Filtration_value *)_Var9._M_current != filt);
  }
  iVar3 = (int)((ulong)((long)filt - (long)last._M_current) >> 1) + -1;
  if (iVar3 < *(int *)Nsimplex[0x10]) {
    iVar3 = *(int *)Nsimplex[0x10];
  }
  *(int *)Nsimplex[0x10] = iVar3;
  pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                     (this,(Siblings *)Nsimplex,
                      (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                      (Nsimplex + 8),last,filt);
  pVar11.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }